

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

void __thiscall
jessilib::io::formatted_message::formatted_message<jessilib::io::text&,jessilib::io::text&>
          (formatted_message *this,u8string *in_format,text *args,text *args_1)

{
  long lVar1;
  initializer_list<jessilib::io::text> __l;
  allocator_type local_79;
  text local_78;
  text local_48;
  
  std::__cxx11::u8string::u8string(&this->m_format,in_format);
  text::text(&local_78,args);
  text::text(&local_48,args_1);
  __l._M_len = 2;
  __l._M_array = &local_78;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,&local_79);
  lVar1 = 0x30;
  do {
    std::__cxx11::u8string::~u8string
              ((u8string *)((long)&local_78.m_string._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}